

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FlatSigningProvider::GetKeyOrigin(FlatSigningProvider *this,CKeyID *keyid,KeyOriginInfo *info)

{
  long lVar1;
  byte bVar2;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  bool ret;
  pair<CPubKey,_KeyOriginInfo> out;
  pair<CPubKey,_KeyOriginInfo> *in_stack_ffffffffffffff38;
  pair<CPubKey,_KeyOriginInfo> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<CPubKey,_KeyOriginInfo>::pair<CPubKey,_KeyOriginInfo,_true>(in_stack_ffffffffffffff38);
  bVar2 = LookupHelper<std::map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>,CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                    (in_RDI,(CKeyID *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40);
  if ((bool)bVar2) {
    KeyOriginInfo::operator=
              ((KeyOriginInfo *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (KeyOriginInfo *)in_stack_ffffffffffffff40);
  }
  std::pair<CPubKey,_KeyOriginInfo>::~pair(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetKeyOrigin(const CKeyID& keyid, KeyOriginInfo& info) const
{
    std::pair<CPubKey, KeyOriginInfo> out;
    bool ret = LookupHelper(origins, keyid, out);
    if (ret) info = std::move(out.second);
    return ret;
}